

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mipmapped_texture::is_vertical_cross(mipmapped_texture *this)

{
  bool bVar1;
  uint uVar2;
  long in_RDI;
  bool local_1;
  
  bVar1 = is_valid((mipmapped_texture *)0x16dcd8);
  if (bVar1) {
    uVar2 = get_num_faces((mipmapped_texture *)0x16dced);
    if (uVar2 < 2) {
      bVar1 = math::is_power_of_2(*(uint32 *)(in_RDI + 0x14));
      if (((!bVar1) || (bVar1 = math::is_power_of_2(*(uint32 *)(in_RDI + 0x10)), bVar1)) ||
         (*(uint *)(in_RDI + 0x14) >> 2 != *(uint *)(in_RDI + 0x10) / 3)) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool mipmapped_texture::is_vertical_cross() const {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  if (get_num_faces() > 1)
    return false;

  if (!((math::is_power_of_2(m_height)) && (!math::is_power_of_2(m_width)) && (m_height / 4U == m_width / 3U)))
    return false;

  return true;
}